

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipTimer.h
# Opt level: O0

void __thiscall
MipTimer::csvMipClockList
          (MipTimer *this,string *grep_query,string *model_name,
          vector<int,_std::allocator<int>_> *mip_clock_list,HighsTimerClock *mip_timer_clock,
          HighsInt kMipClockIdeal,bool header,bool end_line)

{
  double dVar1;
  HighsTimer *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  vector<int,_std::allocator<int>_> *this_02;
  const_reference pvVar2;
  reference pvVar3;
  size_type sVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined1 in_CL;
  byte bVar7;
  undefined7 in_register_00000009;
  void *__buf;
  undefined8 *in_R8;
  int in_R9D;
  double extraout_XMM0_Qa;
  byte in_stack_00000008;
  byte in_stack_00000010;
  double time;
  HighsInt iclock_1;
  HighsInt iX_1;
  double sum_time;
  HighsInt iclock;
  HighsInt iX;
  HighsInt num_clock;
  double ideal_sum_time;
  vector<int,_std::allocator<int>_> *clock;
  HighsTimer *timer_pointer;
  int local_64;
  double local_60;
  int local_50;
  
  this_01 = (vector<int,_std::allocator<int>_> *)CONCAT71(in_register_00000009,in_CL);
  this_00 = (HighsTimer *)*in_R8;
  this_02 = (vector<int,_std::allocator<int>_> *)(in_R8 + 1);
  bVar7 = in_stack_00000008 & 1;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](this_02,(long)in_R9D);
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     (&this_00->clock_time,(long)*pvVar2);
  dVar1 = *pvVar3;
  if (0.01 <= dVar1) {
    sVar4 = std::vector<int,_std::allocator<int>_>::size(this_01);
    if ((in_stack_00000008 & 1) == 0) {
      local_60 = 0.0;
      uVar5 = std::__cxx11::string::c_str();
      uVar6 = std::__cxx11::string::c_str();
      printf("grep_%s,%s,%11.4g",dVar1,uVar5,uVar6);
      for (local_64 = 0; local_64 < (int)sVar4; local_64 = local_64 + 1) {
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](this_01,(long)local_64);
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](this_02,(long)*pvVar2);
        HighsTimer::read(this_00,*pvVar2,__buf,CONCAT71(in_register_00000009,bVar7));
        local_60 = extraout_XMM0_Qa + local_60;
        printf(",%11.4g",extraout_XMM0_Qa);
      }
      printf(",%11.4g",dVar1 - local_60);
      if ((in_stack_00000010 & 1) != 0) {
        printf("\n");
      }
    }
    else {
      uVar5 = std::__cxx11::string::c_str();
      printf("grep_%s,model,ideal",uVar5);
      for (local_50 = 0; local_50 < (int)sVar4; local_50 = local_50 + 1) {
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](this_01,(long)local_50);
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](this_02,(long)*pvVar2);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&this_00->clock_names,(long)*pvVar2);
        uVar5 = std::__cxx11::string::c_str();
        printf(",%s",uVar5);
      }
      printf(",Unaccounted");
      if ((in_stack_00000010 & 1) != 0) {
        printf("\n");
      }
    }
  }
  return;
}

Assistant:

void csvMipClockList(const std::string grep_query,
                       const std::string model_name,
                       const std::vector<HighsInt> mip_clock_list,
                       const HighsTimerClock& mip_timer_clock,
                       const HighsInt kMipClockIdeal, const bool header,
                       const bool end_line) {
    HighsTimer* timer_pointer = mip_timer_clock.timer_pointer_;
    const std::vector<HighsInt>& clock = mip_timer_clock.clock_;
    const double ideal_sum_time =
        timer_pointer->clock_time[clock[kMipClockIdeal]];
    if (ideal_sum_time < 1e-2) return;
    const HighsInt num_clock = mip_clock_list.size();
    if (header) {
      printf("grep_%s,model,ideal", grep_query.c_str());
      for (HighsInt iX = 0; iX < num_clock; iX++) {
        HighsInt iclock = clock[mip_clock_list[iX]];
        printf(",%s", timer_pointer->clock_names[iclock].c_str());
      }
      printf(",Unaccounted");
      if (end_line) printf("\n");
      return;
    }
    double sum_time = 0;
    printf("grep_%s,%s,%11.4g", grep_query.c_str(), model_name.c_str(),
           ideal_sum_time);
    for (HighsInt iX = 0; iX < num_clock; iX++) {
      HighsInt iclock = clock[mip_clock_list[iX]];
      double time = timer_pointer->read(iclock);
      sum_time += time;
      printf(",%11.4g", time);
    }
    printf(",%11.4g", ideal_sum_time - sum_time);
    if (end_line) printf("\n");
  }